

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImGuiWindow *this;
  uint *__src;
  ImGuiID IVar1;
  int iVar2;
  uint *__dest;
  int iVar3;
  int iVar4;
  
  this = GImGui->CurrentWindow;
  IVar1 = ImGuiWindow::GetID(this,str_id_begin,str_id_end);
  iVar2 = (this->IDStack).Size;
  if (iVar2 == (this->IDStack).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar4 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    __dest = (uint *)MemAlloc((long)iVar4 << 2);
    __src = (this->IDStack).Data;
    if (__src != (uint *)0x0) {
      memcpy(__dest,__src,(long)(this->IDStack).Size << 2);
      MemFree((this->IDStack).Data);
    }
    (this->IDStack).Data = __dest;
    (this->IDStack).Capacity = iVar4;
    iVar2 = (this->IDStack).Size;
  }
  else {
    __dest = (this->IDStack).Data;
  }
  __dest[iVar2] = IVar1;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}